

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O3

void anon_unknown.dwarf_1f7001::fillPixels<Imath_3_2::half>
               (Array2D<unsigned_int> *sampleCount,Array2D<Imath_3_2::half_*> *ph,int width,
               int height)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ushort uVar4;
  ushort uVar5;
  char cVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  half **pphVar9;
  uint *puVar10;
  half *phVar11;
  ushort uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  float fVar19;
  int iVar21;
  undefined1 auVar20 [16];
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar41;
  int iVar42;
  int iVar45;
  undefined1 auVar43 [16];
  int iVar46;
  undefined1 auVar44 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar49 [16];
  ulong local_68;
  long lVar24;
  
  lVar14 = (long)width;
  uVar8 = height * lVar14;
  pphVar9 = (half **)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 * 8);
  if (ph->_data != (half **)0x0) {
    operator_delete__(ph->_data);
  }
  ph->_sizeX = (long)height;
  ph->_sizeY = lVar14;
  ph->_data = pphVar9;
  if (0 < height) {
    lVar1 = sampleCount->_sizeY;
    local_68 = 0;
    do {
      if (0 < width) {
        lVar18 = lVar1 * local_68;
        puVar10 = sampleCount->_data;
        uVar8 = 0;
        do {
          phVar11 = (half *)operator_new__((ulong)puVar10[lVar18 + uVar8] * 2);
          auVar7 = _DAT_001bcaf0;
          ph->_data[local_68 * lVar14 + uVar8] = phVar11;
          puVar10 = sampleCount->_data;
          uVar16 = (ulong)puVar10[lVar18 + uVar8];
          if (uVar16 != 0) {
            fVar19 = (float)((uint)((int)local_68 * width + (int)uVar8) % 0x801);
            uVar15 = (uint)fVar19 & 0x7fffff | 0x800000;
            cVar6 = (char)((uint)fVar19 >> 0x17);
            uVar13 = (uint)fVar19 >> 0xd & 0x3ff;
            uVar12 = (ushort)uVar13 | 0x7c00 | (ushort)(uVar13 == 0);
            uVar4 = (ushort)((int)fVar19 + 0x8000fff + (uint)(((uint)fVar19 >> 0xd & 1) != 0) >> 0xd
                            );
            if (0x477fefff < (uint)fVar19) {
              uVar4 = 0x7c00;
            }
            uVar5 = (ushort)(0x80000000 < uVar15 << (cVar6 + 0xa2U & 0x1f)) +
                    (short)(uVar15 >> (0x7eU - cVar6 & 0x1f));
            if ((uint)fVar19 < 0x33000001) {
              uVar5 = 0;
            }
            phVar11 = ph->_data[local_68 * lVar14 + uVar8];
            if (fVar19 == INFINITY) {
              uVar12 = 0x7c00;
            }
            lVar24 = uVar16 - 1;
            if ((uint)fVar19 < 0x7f800000) {
              uVar12 = uVar4;
            }
            auVar20._8_4_ = (int)lVar24;
            auVar20._0_8_ = lVar24;
            auVar20._12_4_ = (int)((ulong)lVar24 >> 0x20);
            if ((uint)fVar19 < 0x38800000) {
              uVar12 = uVar5;
            }
            auVar20 = auVar20 ^ auVar7;
            uVar17 = 0;
            auVar23 = _DAT_001bcae0;
            auVar25 = _DAT_001c0cb0;
            auVar26 = _DAT_001c0ce0;
            auVar27 = _DAT_001c0cd0;
            do {
              auVar28 = auVar23 ^ auVar7;
              iVar42 = auVar20._0_4_;
              iVar41 = -(uint)(iVar42 < auVar28._0_4_);
              iVar21 = auVar20._4_4_;
              auVar29._4_4_ = -(uint)(iVar21 < auVar28._4_4_);
              iVar46 = auVar20._8_4_;
              iVar45 = -(uint)(iVar46 < auVar28._8_4_);
              iVar22 = auVar20._12_4_;
              auVar29._12_4_ = -(uint)(iVar22 < auVar28._12_4_);
              auVar38._4_4_ = iVar41;
              auVar38._0_4_ = iVar41;
              auVar38._8_4_ = iVar45;
              auVar38._12_4_ = iVar45;
              auVar47 = pshuflw(in_XMM8,auVar38,0xe8);
              auVar31._4_4_ = -(uint)(auVar28._4_4_ == iVar21);
              auVar31._12_4_ = -(uint)(auVar28._12_4_ == iVar22);
              auVar31._0_4_ = auVar31._4_4_;
              auVar31._8_4_ = auVar31._12_4_;
              auVar49 = pshuflw(in_XMM9,auVar31,0xe8);
              auVar29._0_4_ = auVar29._4_4_;
              auVar29._8_4_ = auVar29._12_4_;
              auVar48 = pshuflw(auVar47,auVar29,0xe8);
              auVar28._8_4_ = 0xffffffff;
              auVar28._0_8_ = 0xffffffffffffffff;
              auVar28._12_4_ = 0xffffffff;
              auVar28 = (auVar48 | auVar49 & auVar47) ^ auVar28;
              auVar28 = packssdw(auVar28,auVar28);
              if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(ushort *)((long)&phVar11->_h + uVar17) = uVar12;
              }
              auVar29 = auVar31 & auVar38 | auVar29;
              auVar28 = packssdw(auVar29,auVar29);
              auVar48._8_4_ = 0xffffffff;
              auVar48._0_8_ = 0xffffffffffffffff;
              auVar48._12_4_ = 0xffffffff;
              auVar28 = packssdw(auVar28 ^ auVar48,auVar28 ^ auVar48);
              if ((auVar28._0_4_ >> 0x10 & 1) != 0) {
                *(ushort *)((long)&phVar11[1]._h + uVar17) = uVar12;
              }
              auVar28 = auVar25 ^ auVar7;
              iVar41 = -(uint)(iVar42 < auVar28._0_4_);
              auVar43._4_4_ = -(uint)(iVar21 < auVar28._4_4_);
              iVar45 = -(uint)(iVar46 < auVar28._8_4_);
              auVar43._12_4_ = -(uint)(iVar22 < auVar28._12_4_);
              auVar30._4_4_ = iVar41;
              auVar30._0_4_ = iVar41;
              auVar30._8_4_ = iVar45;
              auVar30._12_4_ = iVar45;
              auVar37._4_4_ = -(uint)(auVar28._4_4_ == iVar21);
              auVar37._12_4_ = -(uint)(auVar28._12_4_ == iVar22);
              auVar37._0_4_ = auVar37._4_4_;
              auVar37._8_4_ = auVar37._12_4_;
              auVar43._0_4_ = auVar43._4_4_;
              auVar43._8_4_ = auVar43._12_4_;
              auVar28 = auVar37 & auVar30 | auVar43;
              auVar28 = packssdw(auVar28,auVar28);
              auVar2._8_4_ = 0xffffffff;
              auVar2._0_8_ = 0xffffffffffffffff;
              auVar2._12_4_ = 0xffffffff;
              auVar28 = packssdw(auVar28 ^ auVar2,auVar28 ^ auVar2);
              if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(ushort *)((long)&phVar11[2]._h + uVar17) = uVar12;
              }
              auVar31 = pshufhw(auVar30,auVar30,0x84);
              auVar38 = pshufhw(auVar37,auVar37,0x84);
              auVar29 = pshufhw(auVar31,auVar43,0x84);
              auVar32._8_4_ = 0xffffffff;
              auVar32._0_8_ = 0xffffffffffffffff;
              auVar32._12_4_ = 0xffffffff;
              auVar32 = (auVar29 | auVar38 & auVar31) ^ auVar32;
              auVar31 = packssdw(auVar32,auVar32);
              if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(ushort *)((long)&phVar11[3]._h + uVar17) = uVar12;
              }
              auVar31 = auVar26 ^ auVar7;
              iVar41 = -(uint)(iVar42 < auVar31._0_4_);
              auVar34._4_4_ = -(uint)(iVar21 < auVar31._4_4_);
              iVar45 = -(uint)(iVar46 < auVar31._8_4_);
              auVar34._12_4_ = -(uint)(iVar22 < auVar31._12_4_);
              auVar39._4_4_ = iVar41;
              auVar39._0_4_ = iVar41;
              auVar39._8_4_ = iVar45;
              auVar39._12_4_ = iVar45;
              auVar28 = pshuflw(auVar28,auVar39,0xe8);
              auVar33._4_4_ = -(uint)(auVar31._4_4_ == iVar21);
              auVar33._12_4_ = -(uint)(auVar31._12_4_ == iVar22);
              auVar33._0_4_ = auVar33._4_4_;
              auVar33._8_4_ = auVar33._12_4_;
              in_XMM9 = pshuflw(auVar49 & auVar47,auVar33,0xe8);
              in_XMM9 = in_XMM9 & auVar28;
              auVar34._0_4_ = auVar34._4_4_;
              auVar34._8_4_ = auVar34._12_4_;
              auVar28 = pshuflw(auVar28,auVar34,0xe8);
              auVar47._8_4_ = 0xffffffff;
              auVar47._0_8_ = 0xffffffffffffffff;
              auVar47._12_4_ = 0xffffffff;
              auVar47 = (auVar28 | in_XMM9) ^ auVar47;
              auVar28 = packssdw(auVar47,auVar47);
              if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(ushort *)((long)&phVar11[4]._h + uVar17) = uVar12;
              }
              auVar34 = auVar33 & auVar39 | auVar34;
              auVar28 = packssdw(auVar34,auVar34);
              auVar49._8_4_ = 0xffffffff;
              auVar49._0_8_ = 0xffffffffffffffff;
              auVar49._12_4_ = 0xffffffff;
              auVar28 = packssdw(auVar28 ^ auVar49,auVar28 ^ auVar49);
              if ((auVar28 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(ushort *)((long)&phVar11[5]._h + uVar17) = uVar12;
              }
              auVar28 = auVar27 ^ auVar7;
              iVar42 = -(uint)(iVar42 < auVar28._0_4_);
              auVar44._4_4_ = -(uint)(iVar21 < auVar28._4_4_);
              iVar46 = -(uint)(iVar46 < auVar28._8_4_);
              auVar44._12_4_ = -(uint)(iVar22 < auVar28._12_4_);
              auVar35._4_4_ = iVar42;
              auVar35._0_4_ = iVar42;
              auVar35._8_4_ = iVar46;
              auVar35._12_4_ = iVar46;
              auVar40._4_4_ = -(uint)(auVar28._4_4_ == iVar21);
              auVar40._12_4_ = -(uint)(auVar28._12_4_ == iVar22);
              auVar40._0_4_ = auVar40._4_4_;
              auVar40._8_4_ = auVar40._12_4_;
              auVar44._0_4_ = auVar44._4_4_;
              auVar44._8_4_ = auVar44._12_4_;
              auVar28 = auVar40 & auVar35 | auVar44;
              auVar28 = packssdw(auVar28,auVar28);
              auVar3._8_4_ = 0xffffffff;
              auVar3._0_8_ = 0xffffffffffffffff;
              auVar3._12_4_ = 0xffffffff;
              in_XMM8 = packssdw(auVar28 ^ auVar3,auVar28 ^ auVar3);
              if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(ushort *)((long)&phVar11[6]._h + uVar17) = uVar12;
              }
              auVar28 = pshufhw(auVar35,auVar35,0x84);
              auVar29 = pshufhw(auVar40,auVar40,0x84);
              auVar31 = pshufhw(auVar28,auVar44,0x84);
              auVar36._8_4_ = 0xffffffff;
              auVar36._0_8_ = 0xffffffffffffffff;
              auVar36._12_4_ = 0xffffffff;
              auVar36 = (auVar31 | auVar29 & auVar28) ^ auVar36;
              auVar28 = packssdw(auVar36,auVar36);
              if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(ushort *)((long)&phVar11[7]._h + uVar17) = uVar12;
              }
              lVar24 = auVar23._8_8_;
              auVar23._0_8_ = auVar23._0_8_ + 8;
              auVar23._8_8_ = lVar24 + 8;
              lVar24 = auVar25._8_8_;
              auVar25._0_8_ = auVar25._0_8_ + 8;
              auVar25._8_8_ = lVar24 + 8;
              lVar24 = auVar26._8_8_;
              auVar26._0_8_ = auVar26._0_8_ + 8;
              auVar26._8_8_ = lVar24 + 8;
              lVar24 = auVar27._8_8_;
              auVar27._0_8_ = auVar27._0_8_ + 8;
              auVar27._8_8_ = lVar24 + 8;
              uVar17 = uVar17 + 0x10;
            } while ((uVar16 * 2 + 0xe & 0xfffffffffffffff0) != uVar17);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != (uint)width);
      }
      local_68 = local_68 + 1;
    } while (local_68 != (uint)height);
  }
  return;
}

Assistant:

void
fillPixels (
    Array2D<unsigned int>& sampleCount, Array2D<T*>& ph, int width, int height)
{
    ph.resizeErase (height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            ph[y][x] = new T[sampleCount[y][x]];
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                //
                // We do this because half cannot store number bigger than 2048 exactly.
                //
                ph[y][x][i] = (y * width + x) % 2049;
            }
        }
}